

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmApi.c
# Opt level: O0

Vec_Int_t * Nm_ManReturnNameIds(Nm_Man_t *p)

{
  Vec_Int_t *p_00;
  int local_1c;
  int i;
  Vec_Int_t *vNameIds;
  Nm_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(p->nEntries);
  for (local_1c = 0; local_1c < p->nBins; local_1c = local_1c + 1) {
    if (p->pBinsI2N[local_1c] != (Nm_Entry_t *)0x0) {
      Vec_IntPush(p_00,p->pBinsI2N[local_1c]->ObjId);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Nm_ManReturnNameIds( Nm_Man_t * p )
{
    Vec_Int_t * vNameIds;
    int i;
    vNameIds = Vec_IntAlloc( p->nEntries );
    for ( i = 0; i < p->nBins; i++ )
        if ( p->pBinsI2N[i] )
            Vec_IntPush( vNameIds, p->pBinsI2N[i]->ObjId );
    return vNameIds;
}